

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O3

void __thiscall groundupdb::BucketQuery::BucketQuery(BucketQuery *this,string *bucket)

{
  pointer pcVar1;
  string *psVar2;
  
  (this->super_Query)._vptr_Query = (_func_int **)&PTR__BucketQuery_001d3b50;
  psVar2 = (string *)operator_new(0x20);
  *(string **)&psVar2->field_0x0 = psVar2 + 0x10;
  pcVar1 = (bucket->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar2,pcVar1,pcVar1 + bucket->_M_string_length);
  (this->mImpl)._M_t.
  super___uniq_ptr_impl<groundupdb::BucketQuery::Impl,_std::default_delete<groundupdb::BucketQuery::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_groundupdb::BucketQuery::Impl_*,_std::default_delete<groundupdb::BucketQuery::Impl>_>
  .super__Head_base<0UL,_groundupdb::BucketQuery::Impl_*,_false>._M_head_impl = (Impl *)psVar2;
  return;
}

Assistant:

BucketQuery::BucketQuery(std::string& bucket)
  : mImpl(std::make_unique<Impl>(bucket))
{
  ;
}